

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_vec3 rf_unproject(rf_vec3 source,rf_mat proj,rf_mat view)

{
  rf_mat rVar1;
  rf_mat left;
  undefined1 auVar2 [56];
  rf_mat mat;
  rf_mat right;
  rf_vec3 rVar3;
  rf_quaternion rVar4;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  rf_quaternion quat;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  rf_mat mat_viewProj;
  rf_vec3 source_local;
  undefined4 uStack_14;
  rf_vec3 result;
  
  rVar1 = proj;
  auVar2 = view._8_56_;
  left.m11 = proj.m0;
  left.m15 = proj.m4;
  left.m0 = (float)auVar2._0_4_;
  left.m4 = (float)auVar2._4_4_;
  left.m8 = (float)auVar2._8_4_;
  left.m12 = (float)auVar2._12_4_;
  left.m1 = (float)auVar2._16_4_;
  left.m5 = (float)auVar2._20_4_;
  left.m9 = (float)auVar2._24_4_;
  left.m13 = (float)auVar2._28_4_;
  left.m2 = (float)auVar2._32_4_;
  left.m6 = (float)auVar2._36_4_;
  left.m10 = (float)auVar2._40_4_;
  left.m14 = (float)auVar2._44_4_;
  left.m3 = (float)auVar2._48_4_;
  left.m7 = (float)auVar2._52_4_;
  auVar2 = rVar1._8_56_;
  right._56_8_ = in_stack_ffffffffffffff18;
  right.m0 = (float)auVar2._0_4_;
  right.m4 = (float)auVar2._4_4_;
  right.m8 = (float)auVar2._8_4_;
  right.m12 = (float)auVar2._12_4_;
  right.m1 = (float)auVar2._16_4_;
  right.m5 = (float)auVar2._20_4_;
  right.m9 = (float)auVar2._24_4_;
  right.m13 = (float)auVar2._28_4_;
  right.m2 = (float)auVar2._32_4_;
  right.m6 = (float)auVar2._36_4_;
  right.m10 = (float)auVar2._40_4_;
  right.m14 = (float)auVar2._44_4_;
  right.m3 = (float)auVar2._48_4_;
  right.m7 = (float)auVar2._52_4_;
  rf_mat_mul(left,right);
  mat._8_8_ = mat_viewProj._8_8_;
  mat._0_8_ = mat_viewProj._0_8_;
  mat._16_8_ = mat_viewProj._16_8_;
  mat._24_8_ = mat_viewProj._24_8_;
  mat._32_8_ = mat_viewProj._32_8_;
  mat._40_8_ = mat_viewProj._40_8_;
  mat._48_8_ = mat_viewProj._48_8_;
  mat.m11 = proj.m0;
  mat.m15 = proj.m4;
  rf_mat_invert(mat);
  rVar4.w = 1.0;
  rVar4._0_12_ = source;
  rVar1._8_8_ = uStack_b0;
  rVar1._0_8_ = quat._8_8_;
  rVar1._16_8_ = local_a8;
  rVar1._24_8_ = uStack_a0;
  rVar1._32_8_ = local_98;
  rVar1._40_8_ = uStack_90;
  rVar1._48_8_ = local_88;
  rVar1._56_8_ = uStack_80;
  rVar4 = rf_quaternion_transform(rVar4,rVar1);
  uStack_c8 = rVar4.x;
  uStack_c4 = rVar4.y;
  quat.x = rVar4.z;
  quat.y = rVar4.w;
  rVar3.z = quat.x / quat.y;
  rVar3.x = uStack_c8 / quat.y;
  rVar3.y = uStack_c4 / quat.y;
  return rVar3;
}

Assistant:

RF_API rf_vec3 rf_unproject(rf_vec3 source, rf_mat proj, rf_mat view)
{
    rf_vec3 result = {0.0f, 0.0f, 0.0f};

    // Calculate unproject matrix (multiply view patrix by rf_ctx->gl_ctx.projection matrix) and invert it
    rf_mat mat_viewProj = rf_mat_mul(view, proj);
    mat_viewProj = rf_mat_invert(mat_viewProj);

    // Create quaternion from source point
    rf_quaternion quat = {source.x, source.y, source.z, 1.0f};

    // Multiply quat point by unproject matrix
    quat = rf_quaternion_transform(quat, mat_viewProj);

    // Normalized world points in vectors
    result.x = quat.x / quat.w;
    result.y = quat.y / quat.w;
    result.z = quat.z / quat.w;

    return result;
}